

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O1

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeMinWaste
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWastedArea,
          int *bestIndex)

{
  Rect RVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  int y;
  Rect newNode;
  int wastedArea;
  int local_6c;
  Rect local_68;
  int local_4c;
  int *local_48;
  DisjointRectCollection *local_40;
  int *local_38;
  
  *bestHeight = 0x7fffffff;
  *bestWastedArea = 0x7fffffff;
  *bestIndex = -1;
  local_68.x = 0;
  local_68.y = 0;
  local_68.width = 0;
  local_68.height = 0;
  if ((this->skyLine).Count != 0) {
    local_40 = &this->disjointRects;
    lVar4 = 0;
    uVar3 = 0;
    local_48 = bestHeight;
    local_38 = bestIndex;
    do {
      bVar2 = RectangleFits(this,(int)uVar3,width,height,&local_6c,&local_4c);
      if (bVar2) {
        if ((local_4c < *bestWastedArea) ||
           ((local_4c == *bestWastedArea && (local_6c + height < *local_48)))) {
          *local_48 = local_6c + height;
          *bestWastedArea = local_4c;
          *local_38 = (int)uVar3;
          local_68.x = *(int *)((long)&((this->skyLine).Array)->x + lVar4);
          local_68.y = local_6c;
          local_68.width = width;
          local_68.height = height;
          bVar2 = DisjointRectCollection::Disjoint(local_40,&local_68);
          if (!bVar2) {
            __assert_fail("disjointRects.Disjoint(newNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                          ,0x181,
                          "Rect SkylineBinPack::FindPositionForNewNodeMinWaste(int, int, int &, int &, int &) const"
                         );
          }
        }
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (uVar3 < (this->skyLine).Count);
  }
  RVar1.y = local_68.y;
  RVar1.x = local_68.x;
  RVar1.width = local_68.width;
  RVar1.height = local_68.height;
  return RVar1;
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeMinWaste(int width, int height, int &bestHeight, int &bestWastedArea, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestWastedArea = INT_MAX;
	bestIndex = -1;
	Rect newNode;
	memset(&newNode, 0, sizeof(newNode));
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		int wastedArea;

		if (RectangleFits(i, width, height, y, wastedArea))
		{
			if (wastedArea < bestWastedArea || (wastedArea == bestWastedArea && y + height < bestHeight))
			{
				bestHeight = y + height;
				bestWastedArea = wastedArea;
				bestIndex = i;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y, wastedArea))
		{
			if (wastedArea < bestWastedArea || (wastedArea == bestWastedArea && y + width < bestHeight))
			{
				bestHeight = y + width;
				bestWastedArea = wastedArea;
				bestIndex = i;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}*/
	}

	return newNode;
}